

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::DepthFuncTestCase::test(DepthFuncTestCase *this)

{
  int local_3c;
  int ndx;
  GLenum depthFunctions [8];
  DepthFuncTestCase *this_local;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb74,
             0x201);
  ApiCase::expectError(&this->super_ApiCase,0);
  depthFunctions[0] = 0x201;
  depthFunctions[1] = 0x203;
  depthFunctions[2] = 0x202;
  depthFunctions[3] = 0x204;
  depthFunctions[4] = 0x206;
  depthFunctions[5] = 0x205;
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    glu::CallLogWrapper::glDepthFunc
              (&(this->super_ApiCase).super_CallLogWrapper,depthFunctions[(long)local_3c + -2]);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb74,
               (ulong)depthFunctions[(long)local_3c + -2]);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_DEPTH_FUNC, GL_LESS);
		expectError(GL_NO_ERROR);

		const GLenum depthFunctions[] = {GL_NEVER, GL_ALWAYS, GL_LESS, GL_LEQUAL, GL_EQUAL, GL_GREATER, GL_GEQUAL, GL_NOTEQUAL};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthFunctions); ndx++)
		{
			glDepthFunc(depthFunctions[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_DEPTH_FUNC, depthFunctions[ndx]);
			expectError(GL_NO_ERROR);
		}
	}